

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
HdmiCecSimulationDataGenerator::Initialize
          (HdmiCecSimulationDataGenerator *this,U32 simulation_sample_rate,
          HdmiCecAnalyzerSettings *settings)

{
  BitState BVar1;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  this->mSimulateErrors = false;
  this->mErrorType = ERR_NOERROR;
  ClockGenerator::Init(100000.0,(int)this + 0x18);
  srand(0x2a);
  SimulationChannelDescriptor::SetChannel((Channel *)&this->mCecSimulationData);
  BVar1 = (BitState)&this->mCecSimulationData;
  SimulationChannelDescriptor::SetSampleRate(BVar1);
  SimulationChannelDescriptor::SetInitialBitState(BVar1);
  AdvanceRand(this,0.5,2.0);
  return;
}

Assistant:

void HdmiCecSimulationDataGenerator::Initialize( U32 simulation_sample_rate, HdmiCecAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;
    mSimulateErrors = false; // NOTICE change this to introduce simulation errors
    mErrorType = ERR_NOERROR;

    // Initialize clock at the recomended sampling rate
    mClockGenerator.Init( HdmiCec::MinSampleRateHz, mSimulationSampleRateHz );

    // Initialize the random number generator with a literal seed to obtain repeatability
    // Change this for srand(time(NULL)) for "truly" random sequences
    // NOTICE rand() an srand() are *not* thread safe
    srand( 42 );

    mCecSimulationData.SetChannel( mSettings->mCecChannel );
    mCecSimulationData.SetSampleRate( simulation_sample_rate );
    mCecSimulationData.SetInitialBitState( BIT_HIGH );
    // Advance a few ms in HIGH
    AdvanceRand( 0.5f, 2.0f );
}